

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall ki::dml::value_error::value_error(value_error *this,string *message)

{
  string local_38 [32];
  string *local_18;
  string *message_local;
  value_error *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)message);
  runtime_error::runtime_error(&this->super_runtime_error,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)&this->super_runtime_error = &PTR__value_error_001dbbf8;
  return;
}

Assistant:

value_error(std::string message) : runtime_error(message) { }